

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

void VP8LAddGreenToBlueAndRed_C(uint32_t *src,int num_pixels,uint32_t *dst)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < num_pixels) {
    uVar2 = 0;
    do {
      uVar1 = src[uVar2];
      dst[uVar2] = uVar1 & 0xff00ff00 |
                   (uVar1 >> 8) * 0x10000 + (uVar1 & 0xff00ff) + (uVar1 >> 8 & 0xff) & 0xff00ff;
      uVar2 = uVar2 + 1;
    } while ((uint)num_pixels != uVar2);
  }
  return;
}

Assistant:

void VP8LAddGreenToBlueAndRed_C(const uint32_t* src, int num_pixels,
                                uint32_t* dst) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = src[i];
    const uint32_t green = ((argb >> 8) & 0xff);
    uint32_t red_blue = (argb & 0x00ff00ffu);
    red_blue += (green << 16) | green;
    red_blue &= 0x00ff00ffu;
    dst[i] = (argb & 0xff00ff00u) | red_blue;
  }
}